

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O0

char * TEST_bool_combined(void)

{
  int iVar1;
  char *local_58;
  char *args [3];
  uint local_34;
  uint local_30;
  uint c;
  uint b;
  uint a;
  cargo_t cargo;
  char *pcStack_18;
  int ret;
  char *msg;
  
  pcStack_18 = (char *)0x0;
  cargo._4_4_ = 0;
  iVar1 = cargo_init((cargo_t *)&b,0,"program");
  if (iVar1 == 0) {
    c = 0;
    local_30 = 0;
    local_34 = 0;
    local_58 = "program";
    args[0] = "-abc";
    args[1] = "123";
    cargo._4_4_ = cargo_add_option(_b,0,"--alpha -a",(char *)0x0,"b",&c);
    if (cargo._4_4_ == 0) {
      cargo._4_4_ = cargo_add_option(_b,0,"--beta -b",(char *)0x0,"b",&local_30);
      if (cargo._4_4_ == 0) {
        cargo._4_4_ = cargo_add_option(_b,0,"--centauri -c",(char *)0x0,"b",&local_34);
        if (cargo._4_4_ == 0) {
          cargo._4_4_ = cargo_parse(_b,0,1,3,&local_58);
          if (cargo._4_4_ == 0) {
            printf("a = Expect: %u Got: %u\n",1,(ulong)c);
            if (c == 1) {
              printf("b = Expect: %u Got: %u\n",1,(ulong)local_30);
              if (local_30 == 1) {
                printf("c = Expect: %u Got: %u\n",1,(ulong)local_34);
                if (local_34 != 1) {
                  pcStack_18 = "Expected c == 1";
                }
              }
              else {
                pcStack_18 = "Expected b == 1";
              }
            }
            else {
              pcStack_18 = "Expected a == 1";
            }
          }
          else {
            pcStack_18 = "Parse failed";
          }
        }
        else {
          pcStack_18 = "Failed to add option";
        }
      }
      else {
        pcStack_18 = "Failed to add option";
      }
    }
    else {
      pcStack_18 = "Failed to add option";
    }
    cargo_destroy((cargo_t *)&b);
    msg = pcStack_18;
  }
  else {
    msg = "Failed to init cargo";
  }
  return msg;
}

Assistant:

_TEST_START(TEST_bool_combined)
{
    unsigned int a = 0;
    unsigned int b = 0;
    unsigned int c = 0;
    char *args[] = { "program", "-abc", "123"};

    ret = cargo_add_option(cargo, 0, "--alpha -a", NULL, "b", &a);
    cargo_assert(ret == 0, "Failed to add option");

    ret = cargo_add_option(cargo, 0, "--beta -b", NULL, "b", &b);
    cargo_assert(ret == 0, "Failed to add option");

    ret = cargo_add_option(cargo, 0, "--centauri -c", NULL, "b", &c);
    cargo_assert(ret == 0, "Failed to add option");

    ret = cargo_parse(cargo, 0, 1, sizeof(args) / sizeof(args[0]), args);
    cargo_assert(ret == 0, "Parse failed");

    printf("a = Expect: %u Got: %u\n", 1, a);
    cargo_assert(a == 1, "Expected a == 1");

    printf("b = Expect: %u Got: %u\n", 1, b);
    cargo_assert(b == 1, "Expected b == 1");

    printf("c = Expect: %u Got: %u\n", 1, c);
    cargo_assert(c == 1, "Expected c == 1");

    _TEST_CLEANUP();
}